

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O3

void CB_ADF::finish(cb_adf *data)

{
  pointer ppeVar1;
  label *__ptr;
  void *__ptr_00;
  wclass *pwVar2;
  action_score *__ptr_01;
  ulong uVar3;
  undefined8 *puVar4;
  label *__ptr_02;
  long lVar5;
  
  ppeVar1 = (data->gen_cs).mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppeVar1 != (pointer)0x0) {
    operator_delete(ppeVar1);
  }
  __ptr = (data->cb_labels)._begin;
  if (__ptr != (label *)0x0) {
    free(__ptr);
  }
  (data->cb_labels)._begin = (label *)0x0;
  (data->cb_labels)._end = (label *)0x0;
  (data->cb_labels).end_array = (label *)0x0;
  __ptr_02 = (data->prepped_cs_labels)._begin;
  if ((data->prepped_cs_labels)._end != __ptr_02) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      __ptr_00 = *(void **)((long)&(__ptr_02->costs)._begin + lVar5);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      puVar4 = (undefined8 *)((long)&(__ptr_02->costs)._begin + lVar5);
      *puVar4 = 0;
      puVar4[1] = 0;
      puVar4[2] = 0;
      uVar3 = uVar3 + 1;
      __ptr_02 = (data->prepped_cs_labels)._begin;
      lVar5 = lVar5 + 0x20;
    } while (uVar3 < (ulong)((long)(data->prepped_cs_labels)._end - (long)__ptr_02 >> 5));
  }
  if (__ptr_02 != (label *)0x0) {
    free(__ptr_02);
  }
  (data->prepped_cs_labels)._begin = (label *)0x0;
  (data->prepped_cs_labels)._end = (label *)0x0;
  (data->prepped_cs_labels).end_array = (label *)0x0;
  pwVar2 = (data->cs_labels).costs._begin;
  if (pwVar2 != (wclass *)0x0) {
    free(pwVar2);
  }
  (data->cs_labels).costs._begin = (wclass *)0x0;
  (data->cs_labels).costs._end = (wclass *)0x0;
  (data->cs_labels).costs.end_array = (wclass *)0x0;
  __ptr_01 = (data->a_s)._begin;
  if (__ptr_01 != (action_score *)0x0) {
    free(__ptr_01);
  }
  (data->a_s)._begin = (action_score *)0x0;
  (data->a_s)._end = (action_score *)0x0;
  (data->a_s).end_array = (action_score *)0x0;
  pwVar2 = (data->gen_cs).pred_scores.costs._begin;
  if (pwVar2 != (wclass *)0x0) {
    free(pwVar2);
  }
  (data->gen_cs).pred_scores.costs._begin = (wclass *)0x0;
  (data->gen_cs).pred_scores.costs._end = (wclass *)0x0;
  (data->gen_cs).pred_scores.costs.end_array = (wclass *)0x0;
  return;
}

Assistant:

void finish(cb_adf& data)
{
  data.gen_cs.mtr_ec_seq.~multi_ex();
  data.cb_labels.delete_v();
  for (size_t i = 0; i < data.prepped_cs_labels.size(); i++) data.prepped_cs_labels[i].costs.delete_v();
  data.prepped_cs_labels.delete_v();
  data.cs_labels.costs.delete_v();

  data.a_s.delete_v();
  data.gen_cs.pred_scores.costs.delete_v();
}